

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

JsonObjectWriter * __thiscall Catch::JsonReporter::startObject(JsonReporter *this,StringRef key)

{
  _Elt_pointer pJVar1;
  JsonObjectWriter local_1c0;
  JsonValueWriter local_1a8;
  
  pJVar1 = (this->m_objectWriters).c.
           super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pJVar1 == (this->m_objectWriters).c.
                super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pJVar1 = (this->m_objectWriters).c.
             super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  JsonObjectWriter::write((JsonObjectWriter *)&local_1a8,(int)pJVar1 + -0x18,key.m_start,key.m_size)
  ;
  JsonValueWriter::writeObject(&local_1c0,&local_1a8);
  std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>::
  emplace_back<Catch::JsonObjectWriter>(&(this->m_objectWriters).c,&local_1c0);
  JsonObjectWriter::~JsonObjectWriter(&local_1c0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a8.m_sstream);
  local_1a8.m_os._0_4_ = 0;
  std::deque<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>::
  emplace_back<Catch::JsonReporter::Writer>(&(this->m_writers).c,(Writer *)&local_1a8);
  pJVar1 = (this->m_objectWriters).c.
           super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pJVar1 == (this->m_objectWriters).c.
                super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pJVar1 = (this->m_objectWriters).c.
             super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  return pJVar1 + -1;
}

Assistant:

JsonObjectWriter& JsonReporter::startObject( StringRef key ) {
        m_objectWriters.emplace(
            m_objectWriters.top().write( key ).writeObject() );
        m_writers.emplace( Writer::Object );
        return m_objectWriters.top();
    }